

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  IdxElement *pIVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  IdxElement tmp;
  
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  iVar10 = end + -1;
  if (iVar10 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (keys,end,compare,start2,type);
    return iVar10;
  }
  iVar9 = (start2 + iVar10) / 2;
  pIVar1 = keys + iVar9;
  dVar4 = keys[iVar9].val;
  lVar12 = (long)iVar10;
  lVar15 = (long)start2;
  iVar9 = iVar10;
  iVar13 = start2;
  do {
    lVar16 = (long)iVar13;
    iVar14 = iVar10;
    if (iVar10 < iVar13) {
      iVar14 = iVar13;
    }
    if (type) {
      pdVar11 = &keys[lVar16].val;
      for (; lVar16 < lVar12; lVar16 = lVar16 + 1) {
        if (*pdVar11 <= dVar4) {
          iVar14 = (int)lVar16;
          break;
        }
        pdVar11 = pdVar11 + 2;
      }
      lVar16 = (long)iVar9;
      if (start2 <= iVar9) {
        iVar9 = start2;
      }
      pdVar11 = &keys[lVar16].val;
      for (; lVar15 < lVar16; lVar16 = lVar16 + -1) {
        dVar5 = *pdVar11;
        if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (dVar4 - dVar5 < 0.0)) {
          iVar9 = (int)lVar16;
          break;
        }
        pdVar11 = pdVar11 + -2;
      }
    }
    else {
      lVar17 = (long)iVar9;
      pdVar11 = &keys[lVar16].val;
      for (; lVar16 < lVar12; lVar16 = lVar16 + 1) {
        dVar5 = *pdVar11;
        if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (0.0 < dVar4 - dVar5)) {
          iVar14 = (int)lVar16;
          break;
        }
        pdVar11 = pdVar11 + 2;
      }
      if (start2 <= iVar9) {
        iVar9 = start2;
      }
      pdVar11 = &keys[lVar17].val;
      for (; lVar15 < lVar17; lVar17 = lVar17 + -1) {
        if (dVar4 < *pdVar11 || dVar4 == *pdVar11) {
          iVar9 = (int)lVar17;
          break;
        }
        pdVar11 = pdVar11 + -2;
      }
    }
    if (iVar9 <= iVar14) break;
    pIVar2 = keys + iVar14;
    iVar13 = pIVar2->idx;
    uVar8 = *(undefined4 *)&pIVar2->field_0x4;
    dVar5 = pIVar2->val;
    pIVar2 = keys + iVar9;
    uVar7 = *(undefined4 *)&pIVar2->field_0x4;
    dVar6 = pIVar2->val;
    pIVar3 = keys + iVar14;
    pIVar3->idx = pIVar2->idx;
    *(undefined4 *)&pIVar3->field_0x4 = uVar7;
    pIVar3->val = dVar6;
    pIVar2 = keys + iVar9;
    pIVar2->idx = iVar13;
    *(undefined4 *)&pIVar2->field_0x4 = uVar8;
    pIVar2->val = dVar5;
    iVar13 = iVar14 + 1;
    iVar9 = iVar9 + -1;
  } while( true );
  if (type) {
    lVar16 = (long)iVar14;
    if (iVar10 < iVar14) {
      iVar10 = iVar14;
    }
    iVar14 = iVar10;
    pdVar11 = &keys[lVar16].val;
    for (; lVar16 < lVar12; lVar16 = lVar16 + 1) {
      dVar5 = *pdVar11;
      if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (dVar5 - dVar4 < 0.0)) {
        iVar14 = (int)lVar16;
        break;
      }
      pdVar11 = pdVar11 + 2;
    }
    if (iVar14 == start2) {
      pIVar2 = keys + lVar15;
      iVar10 = pIVar2->idx;
      uVar8 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar7 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar15;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar7;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar10;
      *(undefined4 *)&pIVar1->field_0x4 = uVar8;
      pIVar1->val = dVar4;
      iVar14 = start2 + 1;
    }
  }
  else {
    lVar16 = (long)iVar9;
    if (start2 <= iVar9) {
      iVar9 = start2;
    }
    pdVar11 = &keys[lVar16].val;
    for (; lVar15 < lVar16; lVar16 = lVar16 + -1) {
      dVar5 = *pdVar11;
      if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (0.0 < dVar5 - dVar4)) {
        iVar9 = (int)lVar16;
        break;
      }
      pdVar11 = pdVar11 + -2;
    }
    if (iVar9 == iVar10) {
      pIVar2 = keys + lVar12;
      iVar10 = pIVar2->idx;
      uVar8 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar7 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar12;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar7;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar10;
      *(undefined4 *)&pIVar1->field_0x4 = uVar8;
      pIVar1->val = dVar4;
      iVar9 = end + -2;
    }
  }
  if (iVar9 - start2 < size * 2) {
    SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (keys,iVar9 + 1,compare,start2,!type);
    if (size <= iVar14 - start2) {
      return iVar14 + -1;
    }
    size = (start2 + size) - iVar14;
    start2 = iVar14;
  }
  else {
    end = iVar9 + 1;
  }
  iVar10 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                     (keys,compare,start,end,size,start2,end2,!type);
  return iVar10;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}